

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

FunctionValue *
CreateGenericFunctionInstance
          (FunctionValue *__return_storage_ptr__,ExpressionContext *ctx,SynBase *source,
          FunctionValue proto,IntrusiveList<TypeHandle> generics,ArrayView<ArgumentData> arguments,
          bool standalone)

{
  TypeBase **ppTVar1;
  __jmp_buf_tag *__env;
  Allocator *pAVar2;
  SynIdentifier *pSVar3;
  TypeHandle *pTVar4;
  TypeHandle *pTVar5;
  Lexeme *pLVar6;
  long lVar7;
  ScopeData *pSVar8;
  long lVar9;
  SynShortFunctionDefinition *syntax;
  ExprVariableDefinition *node;
  ExprBase *pEVar10;
  ExprBase **ppEVar11;
  char *pcVar12;
  char *pcVar13;
  undefined8 uVar14;
  undefined4 uVar15;
  IntrusiveList<MatchData> matches;
  TypeBase *pTVar16;
  bool bVar17;
  int iVar18;
  uint uVar19;
  undefined4 extraout_var;
  TypeFunction *argumentType;
  size_t sVar20;
  char *pcVar21;
  SynFunctionDefinition *syntax_00;
  ExprBase *pEVar22;
  SynBase *pSVar23;
  byte bVar24;
  TypeBase *pTVar25;
  char *pcVar26;
  ulong uVar27;
  uint uVar28;
  MatchData *pMVar29;
  ulong uVar30;
  TypeBase *pTVar31;
  int iVar32;
  TypeBase *pTVar33;
  FunctionData *pFVar34;
  ArrayView<ArgumentData> functionArguments;
  ArrayView<ArgumentData> arguments_00;
  ArrayView<CallArgumentData> arguments_01;
  IntrusiveList<MatchData> aliases;
  TraceScope traceScope;
  SmallArray<CallArgumentData,_16U> result;
  jmp_buf prevErrorHandler;
  IntrusiveList<MatchData> local_248;
  ExprBase *local_238;
  char *local_230;
  ScopeData *local_228;
  TraceScope local_220;
  SmallArray<CallArgumentData,_16U> local_210;
  undefined1 local_f8 [200];
  MatchData *node_00;
  
  pTVar25 = (TypeBase *)generics.head;
  pAVar2 = ctx->allocator;
  memset(local_210.little,0,0x100);
  local_210.count = 0;
  local_210.max = 0x10;
  uVar14 = ((proto.function)->arguments).data;
  uVar15 = ((proto.function)->arguments).count;
  functionArguments.count = uVar15;
  functionArguments.data = (ArgumentData *)uVar14;
  functionArguments._12_4_ = 0;
  arguments_00._12_4_ = 0;
  arguments_00.data = (ArgumentData *)SUB128(arguments._0_12_,0);
  arguments_00.count = SUB124(arguments._0_12_,8);
  local_210.data = local_210.little;
  local_210.allocator = pAVar2;
  bVar17 = PrepareArgumentsForFunctionCall
                     (ctx,source,functionArguments,arguments_00,&local_210,(uint *)0x0,false);
  if (!bVar17) {
    __assert_fail("!\"unexpected\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1ab6,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  local_228 = (ScopeData *)(proto.function)->scope->ownerType;
  local_238 = proto.context;
  if ((TypeStruct *)(proto.context)->type == ctx->typeAutoRef) {
    if ((local_228 == (ScopeData *)0x0) ||
       (bVar24 = *(byte *)((long)&local_228->startOffset + 4), bVar24 == 1)) {
      __assert_fail("function->scope->ownerType && !function->scope->ownerType->isGeneric",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1abc,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
LAB_0015dd70:
    if ((bVar24 & 1) != 0) {
      anon_unknown.dwarf_c3752::Stop
                (ctx,source,"ERROR: generic type arguments required for type \'%.*s\'",
                 (ulong)(uint)(*(int *)&local_228->ownerFunction - (int)local_228->ownerNamespace));
    }
  }
  else {
    if ((local_228 != (ScopeData *)0x0) &&
       (local_228 = ((TypeStruct *)(proto.context)->type)->typeScope, local_228 != (ScopeData *)0x0)
       ) {
      bVar24 = *(byte *)((long)&local_228->startOffset + 4);
      goto LAB_0015dd70;
    }
    local_228 = (ScopeData *)0x0;
  }
  local_248.head = (MatchData *)0x0;
  local_248.tail = (MatchData *)0x0;
  pMVar29 = ((proto.function)->generics).head;
  if (pTVar25 != (TypeBase *)0x0 && pMVar29 != (MatchData *)0x0) {
    pTVar33 = pTVar25;
    do {
      if (((SynIdentifier *)pTVar33->_vptr_TypeBase != (SynIdentifier *)0x0) &&
         ((((SynIdentifier *)pTVar33->_vptr_TypeBase)->super_SynBase).typeID == 0))
      goto LAB_0015e370;
      iVar18 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x20);
      node_00 = (MatchData *)CONCAT44(extraout_var,iVar18);
      pSVar3 = pMVar29->name;
      pTVar31 = (TypeBase *)pTVar33->_vptr_TypeBase;
      node_00->name = pSVar3;
      node_00->type = pTVar31;
      node_00->next = (MatchData *)0x0;
      node_00->listed = false;
      if (pSVar3 == (SynIdentifier *)0x0) {
        __assert_fail("name",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                      ,0xf6,"MatchData::MatchData(SynIdentifier *, TypeBase *)");
      }
      IntrusiveList<MatchData>::push_back(&local_248,node_00);
      pMVar29 = pMVar29->next;
    } while ((pMVar29 != (MatchData *)0x0) &&
            (pTVar33 = *(TypeBase **)&pTVar33->typeID, pTVar33 != (TypeBase *)0x0));
  }
  pSVar8 = local_228;
  arguments_01.count = local_210.count;
  arguments_01.data = local_210.data;
  arguments_01._12_4_ = 0;
  argumentType = GetGenericFunctionInstanceType
                           (ctx,source,(TypeBase *)local_228,proto.function,arguments_01,&local_248)
  ;
  if (argumentType == (TypeFunction *)0x0) {
    anon_unknown.dwarf_c3752::Report
              (ctx,source,"ERROR: failed to instantiate generic function \'%.*s\'",
               (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                            (int)((proto.function)->name->name).begin));
LAB_0015e370:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
    goto LAB_0015e6e9;
  }
  if ((argumentType->super_TypeBase).isGeneric != false) {
    __assert_fail("!instance->isGeneric",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                  ,0x1adf,
                  "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                 );
  }
  uVar19 = ((proto.function)->instances).count;
  if ((ulong)uVar19 != 0) {
    uVar30 = 0;
    do {
      pFVar34 = ((proto.function)->instances).data[uVar30];
      if (pSVar8 == (ScopeData *)pFVar34->scope->ownerType) {
        pTVar33 = (TypeBase *)(pFVar34->generics).head;
        iVar32 = 0;
        iVar18 = 0;
        if (pTVar33 != (TypeBase *)0x0) {
          iVar18 = 0;
          pTVar31 = pTVar33;
          do {
            iVar18 = iVar18 + 1;
            pTVar31 = (TypeBase *)(pTVar31->name).begin;
          } while (pTVar31 != (TypeBase *)0x0);
        }
        if (pTVar25 != (TypeBase *)0x0) {
          iVar32 = 0;
          pTVar31 = pTVar25;
          do {
            iVar32 = iVar32 + 1;
            pTVar31 = *(TypeBase **)&pTVar31->typeID;
          } while (pTVar31 != (TypeBase *)0x0);
        }
        if (iVar18 == iVar32) {
          pTVar16 = pTVar25;
          pTVar31 = pTVar33;
          if (pTVar25 != (TypeBase *)0x0) {
            while (pTVar31 != (TypeBase *)0x0) {
              if (*(SynIdentifier **)&pTVar33->typeID != (SynIdentifier *)pTVar16->_vptr_TypeBase)
              goto LAB_0015df75;
              pTVar33 = (TypeBase *)(pTVar33->name).begin;
              if (pTVar33 == (TypeBase *)0x0) break;
              ppTVar1 = (TypeBase **)&pTVar16->typeID;
              pTVar16 = *ppTVar1;
              pTVar31 = *ppTVar1;
            }
          }
          pTVar5 = (pFVar34->type->arguments).head;
          for (pTVar4 = (argumentType->arguments).head;
              (pTVar5 != (TypeHandle *)0x0 && (pTVar4 != (TypeHandle *)0x0)); pTVar4 = pTVar4->next)
          {
            if (pTVar5->type != pTVar4->type) goto LAB_0015df75;
            pTVar5 = pTVar5->next;
          }
          if (pTVar5 == pTVar4) {
            pEVar22 = local_238;
            if (pSVar8 == (ScopeData *)0x0) {
              if ((local_238 == (ExprBase *)0x0) || (local_238->typeID != 9)) {
                __assert_fail("isType<ExprNullptrLiteral>(context)",
                              "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                              ,0x1af3,
                              "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                             );
              }
              pSVar23 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
              pEVar22 = CreateFunctionContextAccess(ctx,pSVar23,pFVar34);
              uVar19 = ((proto.function)->instances).count;
            }
            if (uVar19 <= (uint)uVar30) {
              __assert_fail("index < count",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                            ,0x199,
                            "T &SmallArray<FunctionData *, 8>::operator[](unsigned int) [T = FunctionData *, N = 8]"
                           );
            }
            pFVar34 = ((proto.function)->instances).data[uVar30];
            __return_storage_ptr__->source = source;
            __return_storage_ptr__->function = pFVar34;
            __return_storage_ptr__->context = pEVar22;
            if (pEVar22 != (ExprBase *)0x0) goto LAB_0015e6e9;
            goto LAB_0015e78b;
          }
        }
      }
LAB_0015df75:
      uVar30 = uVar30 + 1;
    } while (uVar30 != uVar19);
  }
  if ((CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
       ::token == '\0') &&
     (iVar18 = __cxa_guard_acquire(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                                    ::token), iVar18 != 0)) {
    CreateGenericFunctionInstance::token =
         NULLC::TraceGetToken("analyze","CreateGenericFunctionInstance");
    __cxa_guard_release(&CreateGenericFunctionInstance(ExpressionContext&,SynBase*,FunctionValue,IntrusiveList<TypeHandle>,ArrayView<ArgumentData>,bool)
                         ::token);
  }
  NULLC::TraceScope::TraceScope(&local_220,CreateGenericFunctionInstance::token);
  lVar9 = NULLC::traceContext;
  pSVar3 = (proto.function)->name;
  if ((pSVar3 != (SynIdentifier *)0x0) &&
     (pLVar6 = (pSVar3->super_SynBase).begin, pLVar6 != (Lexeme *)0x0)) {
    pcVar21 = pLVar6->pos;
    uVar30 = (long)((pSVar3->super_SynBase).end)->pos - (long)pcVar21;
    iVar18 = (int)uVar30;
    if (iVar18 != 0) {
      uVar28 = iVar18 + 1;
      uVar19 = *(uint *)(NULLC::traceContext + 0x264);
      if ((uVar19 <= *(int *)(NULLC::traceContext + 0x260) + uVar28) ||
         (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
        NULLC::TraceDump();
        uVar19 = *(uint *)(lVar9 + 0x264);
      }
      if (uVar19 <= uVar28) {
        __assert_fail("count + 1 < context.labels.max",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                      ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
      }
      uVar19 = *(uint *)(lVar9 + 0x260);
      memcpy((void *)((ulong)uVar19 + *(long *)(lVar9 + 0x268)),pcVar21,uVar30 & 0xffffffff);
      *(undefined1 *)(*(long *)(lVar9 + 0x268) + (ulong)(uint)(*(int *)(lVar9 + 0x260) + iVar18)) =
           0;
      *(int *)(lVar9 + 0x260) = *(int *)(lVar9 + 0x260) + uVar28;
      lVar7 = *(long *)(lVar9 + 0x278);
      uVar28 = *(uint *)(lVar9 + 0x270);
      *(uint *)(lVar9 + 0x270) = uVar28 + 1;
      *(uint *)(lVar7 + (ulong)uVar28 * 8) = uVar19 * 4 + 2;
      *(undefined4 *)(lVar7 + 4 + (ulong)uVar28 * 8) = 0;
    }
  }
  pSVar8 = ctx->scope;
  pSVar23 = (proto.function)->source;
  ctx->scope = (proto.function)->scope;
  ctx->lookupLocation = pSVar23;
  uVar19 = ctx->functionInstanceDepth + 1;
  ctx->functionInstanceDepth = uVar19;
  if (0x40 < uVar19) {
    anon_unknown.dwarf_c3752::Stop
              (ctx,source,"ERROR: reached maximum generic function instance depth (%d)",0x40);
  }
  __env = ctx->errorHandler;
  memcpy(local_f8,__env,200);
  bVar17 = ctx->errorHandlerNested;
  ctx->errorHandlerNested = true;
  uVar19 = *(uint *)(NULLC::traceContext + 0x244);
  iVar18 = _setjmp((__jmp_buf_tag *)__env);
  lVar9 = NULLC::traceContext;
  if (iVar18 == 0) {
    syntax_00 = GetGenericFunctionDefinition(ctx,source,proto.function);
    if (syntax_00 == (SynFunctionDefinition *)0x0) {
      syntax = (SynShortFunctionDefinition *)(proto.function)->declaration->source;
      if ((syntax == (SynShortFunctionDefinition *)0x0) || ((syntax->super_SynBase).typeID != 0x39))
      {
        anon_unknown.dwarf_c3752::Stop
                  (ctx,source,"ERROR: imported generic function call is not supported");
      }
      pEVar22 = AnalyzeShortFunctionDefinition(ctx,syntax,proto.function,argumentType);
    }
    else {
      matches.tail = local_248.tail;
      matches.head = local_248.head;
      pEVar22 = AnalyzeFunctionDefinition
                          (ctx,syntax_00,proto.function,argumentType,(TypeBase *)local_228,matches,
                           false,false,false);
    }
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar8;
    ctx->lookupLocation = (SynBase *)0x0;
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar17;
    if ((pEVar22 == (ExprBase *)0x0) || (pEVar22->typeID != 0x24)) {
      __assert_fail("definition",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                    ,0x1b66,
                    "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                   );
    }
    node = *(ExprVariableDefinition **)&pEVar22[2].typeID;
    if (node != (ExprVariableDefinition *)0x0) {
      pEVar10 = (proto.function)->declaration;
      if ((pEVar10 == (ExprBase *)0x0) || (pEVar10->typeID != 0x25)) {
        uVar19 = (ctx->setup).count;
        if (uVar19 == (ctx->setup).max) {
          SmallArray<ExprBase_*,_128U>::grow(&ctx->setup,uVar19);
        }
        ppEVar11 = (ctx->setup).data;
        if (ppEVar11 == (ExprBase **)0x0) {
          __assert_fail("data",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                        ,0x162,
                        "void SmallArray<ExprBase *, 128>::push_back(const T &) [T = ExprBase *, N = 128]"
                       );
        }
        uVar19 = (ctx->setup).count;
        (ctx->setup).count = uVar19 + 1;
        ppEVar11[uVar19] = &node->super_ExprBase;
      }
      else {
        IntrusiveList<ExprVariableDefinition>::push_back
                  ((IntrusiveList<ExprVariableDefinition> *)&pEVar10[1].typeID,node);
      }
    }
    if (standalone) goto LAB_0015e6cc;
    pFVar34 = (FunctionData *)pEVar22[1]._vptr_ExprBase;
    if (pFVar34->scope->ownerType == (TypeBase *)0x0) {
      if ((proto.context == (ExprBase *)0x0) || ((proto.context)->typeID != 9)) {
        __assert_fail("isType<ExprNullptrLiteral>(context)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b77,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      pSVar23 = &ExpressionContext::MakeInternal(ctx,source)->super_SynBase;
      proto.context =
           CreateFunctionContextAccess(ctx,pSVar23,(FunctionData *)pEVar22[1]._vptr_ExprBase);
      pFVar34 = (FunctionData *)pEVar22[1]._vptr_ExprBase;
    }
    pEVar22 = CreateSequence(ctx,source,pEVar22,proto.context);
    __return_storage_ptr__->source = source;
    __return_storage_ptr__->function = pFVar34;
    __return_storage_ptr__->context = pEVar22;
    if (pEVar22 == (ExprBase *)0x0) {
LAB_0015e78b:
      __assert_fail("context",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/TypeTree.h"
                    ,0x289,"FunctionValue::FunctionValue(SynBase *, FunctionData *, ExprBase *)");
    }
  }
  else {
    uVar28 = *(uint *)(NULLC::traceContext + 0x244);
    while (uVar19 < uVar28) {
      NULLC::TraceLeave(0.0,0,0);
      uVar28 = *(uint *)(lVar9 + 0x244);
    }
    ctx->functionInstanceDepth = ctx->functionInstanceDepth - 1;
    ctx->scope = pSVar8;
    ctx->lookupLocation = (SynBase *)0x0;
    pcVar21 = ctx->errorBuf;
    if (pcVar21 != (char *)0x0) {
      sVar20 = strlen(pcVar21);
      local_230 = pcVar21 + sVar20;
      iVar18 = NULLC::SafeSprintf(local_230,(ulong)(ctx->errorBufSize - (int)sVar20),
                                  "while instantiating generic function %.*s(",
                                  (ulong)(uint)(*(int *)&((proto.function)->name->name).end -
                                               (int)((proto.function)->name->name).begin));
      pcVar21 = local_230 + iVar18;
      for (pTVar4 = ((proto.function)->type->arguments).head; pTVar4 != (TypeHandle *)0x0;
          pTVar4 = pTVar4->next) {
        pcVar26 = ", ";
        if (pTVar4 == ((proto.function)->type->arguments).head) {
          pcVar26 = "";
        }
        iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                   ctx->errorBufSize),"%s%.*s",pcVar26,
                                    (ulong)(uint)(*(int *)&(pTVar4->type->name).end -
                                                 (int)(pTVar4->type->name).begin));
        pcVar21 = pcVar21 + iVar18;
      }
      iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                 ctx->errorBufSize),")");
      pcVar21 = pcVar21 + iVar18;
      if (arguments.count != 0) {
        iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                   ctx->errorBufSize),"\n  using argument(s) (");
        pcVar21 = pcVar21 + iVar18;
        if (arguments.count != 0) {
          uVar27 = 0;
          uVar30 = uVar27;
          do {
            pcVar26 = ", ";
            if (uVar30 == 0) {
              pcVar26 = "";
            }
            lVar9 = *(long *)((long)&(arguments.data)->type + uVar30);
            iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                       ctx->errorBufSize),"%s%.*s",pcVar26,
                                        (ulong)(uint)(*(int *)(lVar9 + 0x18) -
                                                     (int)*(undefined8 *)(lVar9 + 0x10)));
            pcVar21 = pcVar21 + iVar18;
            uVar27 = uVar27 + 1;
            uVar30 = uVar30 + 0x30;
          } while (uVar27 < arguments.count);
        }
        iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                   ctx->errorBufSize),")");
        pcVar21 = pcVar21 + iVar18;
      }
      if (local_248.head != (MatchData *)0x0) {
        iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                   ctx->errorBufSize),"\n  with [");
        pcVar21 = pcVar21 + iVar18;
        for (pMVar29 = local_248.head; pMVar29 != (MatchData *)0x0; pMVar29 = pMVar29->next) {
          pcVar26 = ", ";
          if (pMVar29 == local_248.head) {
            pcVar26 = "";
          }
          pcVar12 = (pMVar29->name->name).begin;
          pcVar13 = (pMVar29->type->name).begin;
          iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                     ctx->errorBufSize),"%s%.*s = %.*s",pcVar26,
                                      (ulong)(uint)(*(int *)&(pMVar29->name->name).end -
                                                   (int)pcVar12),pcVar12,
                                      *(int *)&(pMVar29->type->name).end - (int)pcVar13,pcVar13);
          pcVar21 = pcVar21 + iVar18;
        }
        iVar18 = NULLC::SafeSprintf(pcVar21,(ulong)((*(int *)&ctx->errorBuf - (int)pcVar21) +
                                                   ctx->errorBufSize),"]");
        pcVar21 = pcVar21 + iVar18;
      }
      anon_unknown.dwarf_c3752::AddRelatedErrorInfoWithLocation(ctx,source,local_230,pcVar21);
    }
    memcpy(__env,local_f8,200);
    ctx->errorHandlerNested = bVar17;
    if (bVar17 != false) {
      if (ctx->errorHandlerActive == false) {
        __assert_fail("ctx.errorHandlerActive",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                      ,0x1b52,
                      "FunctionValue CreateGenericFunctionInstance(ExpressionContext &, SynBase *, FunctionValue, IntrusiveList<TypeHandle>, ArrayView<ArgumentData>, bool)"
                     );
      }
      longjmp((__jmp_buf_tag *)__env,1);
    }
    ctx->errorCount = ctx->errorCount + 1;
LAB_0015e6cc:
    __return_storage_ptr__->source = (SynBase *)0x0;
    __return_storage_ptr__->function = (FunctionData *)0x0;
    __return_storage_ptr__->context = (ExprBase *)0x0;
  }
  NULLC::TraceScope::~TraceScope(&local_220);
LAB_0015e6e9:
  SmallArray<CallArgumentData,_16U>::~SmallArray(&local_210);
  return __return_storage_ptr__;
}

Assistant:

FunctionValue CreateGenericFunctionInstance(ExpressionContext &ctx, SynBase *source, FunctionValue proto, IntrusiveList<TypeHandle> generics, ArrayView<ArgumentData> arguments, bool standalone)
{
	FunctionData *function = proto.function;

	SmallArray<CallArgumentData, 16> result(ctx.allocator);

	if(!PrepareArgumentsForFunctionCall(ctx, source, function->arguments, arguments, result, NULL, false))
		assert(!"unexpected");

	TypeBase *parentType = NULL;

	if(proto.context->type == ctx.typeAutoRef)
	{
		assert(function->scope->ownerType && !function->scope->ownerType->isGeneric);
		parentType = function->scope->ownerType;
	}
	else if(function->scope->ownerType)
	{
		parentType = getType<TypeRef>(proto.context->type)->subType;
	}

	if(parentType && parentType->isGeneric)
		Stop(ctx, source, "ERROR: generic type arguments required for type '%.*s'", FMT_ISTR(parentType->name));

	IntrusiveList<MatchData> aliases;

	{
		MatchData *currMatch = function->generics.head;
		TypeHandle *currGeneric = generics.head;

		for(; currMatch && currGeneric; currMatch = currMatch->next, currGeneric = currGeneric->next)
		{
			if(isType<TypeError>(currGeneric->type))
				return FunctionValue();

			aliases.push_back(new (ctx.get<MatchData>()) MatchData(currMatch->name, currGeneric->type));
		}
	}

	TypeFunction *instance = GetGenericFunctionInstanceType(ctx, source, parentType, function, result, aliases);

	if(!instance)
	{
		Report(ctx, source, "ERROR: failed to instantiate generic function '%.*s'", FMT_ISTR(function->name->name));

		return FunctionValue();
	}

	assert(!instance->isGeneric);

	// Search for an existing function
	for(unsigned i = 0; i < function->instances.size(); i++)
	{
		FunctionData *data = function->instances[i];

		if(parentType != data->scope->ownerType)
			continue;

		if(!SameGenerics(data->generics, generics))
			continue;

		if(!SameArguments(data->type, instance))
			continue;

		ExprBase *context = proto.context;

		if(!data->scope->ownerType)
		{
			assert(isType<ExprNullptrLiteral>(context));

			context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), data);
		}

		return FunctionValue(source, function->instances[i], context);
	}

	TRACE_SCOPE("analyze", "CreateGenericFunctionInstance");

	if(proto.function->name && proto.function->name->begin)
		TRACE_LABEL2(proto.function->name->begin->pos, proto.function->name->end->pos);

	// Switch to original function scope
	ScopeData *scope = ctx.scope;

	ctx.SwitchToScopeAtPoint(function->scope, function->source);

	ctx.functionInstanceDepth++;

	if(ctx.functionInstanceDepth > NULLC_MAX_GENERIC_INSTANCE_DEPTH)
		Stop(ctx, source, "ERROR: reached maximum generic function instance depth (%d)", NULLC_MAX_GENERIC_INSTANCE_DEPTH);

	jmp_buf prevErrorHandler;
	memcpy(&prevErrorHandler, &ctx.errorHandler, sizeof(jmp_buf));

	bool prevErrorHandlerNested = ctx.errorHandlerNested;
	ctx.errorHandlerNested = true;

	ExprBase *expr = NULL;
	
	unsigned traceDepth = NULLC::TraceGetDepth();

	if(!setjmp(ctx.errorHandler))
	{
		if(SynFunctionDefinition *syntax = GetGenericFunctionDefinition(ctx, source, function))
			expr = AnalyzeFunctionDefinition(ctx, syntax, function, instance, parentType, aliases, false, false, false);
		else if(SynShortFunctionDefinition *node = getType<SynShortFunctionDefinition>(function->declaration->source))
			expr = AnalyzeShortFunctionDefinition(ctx, node, function, instance);
		else
			Stop(ctx, source, "ERROR: imported generic function call is not supported");
	}
	else
	{
		NULLC::TraceLeaveTo(traceDepth);

		ctx.functionInstanceDepth--;

		// Restore old scope
		ctx.SwitchToScopeAtPoint(scope, NULL);

		// Additional error info
		if(ctx.errorBuf)
		{
			char *errorCurr = ctx.errorBuf + strlen(ctx.errorBuf);

			const char *messageStart = errorCurr;

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "while instantiating generic function %.*s(", FMT_ISTR(function->name->name));

			for(TypeHandle *curr = function->type->arguments.head; curr; curr = curr->next)
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", curr != function->type->arguments.head ? ", " : "", FMT_ISTR(curr->type->name));

			errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");

			if(!arguments.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  using argument(s) (");

				for(unsigned i = 0; i < arguments.size(); i++)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s", i != 0 ? ", " : "", FMT_ISTR(arguments[i].type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), ")");
			}

			if(!aliases.empty())
			{
				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "\n  with [");

				for(MatchData *curr = aliases.head; curr; curr = curr->next)
					errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "%s%.*s = %.*s", curr != aliases.head ? ", " : "", FMT_ISTR(curr->name->name), FMT_ISTR(curr->type->name));

				errorCurr += NULLC::SafeSprintf(errorCurr, ctx.errorBufSize - unsigned(errorCurr - ctx.errorBuf), "]");
			}

			const char *messageEnd = errorCurr;

			AddRelatedErrorInfoWithLocation(ctx, source, messageStart, messageEnd);
		}

		memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
		ctx.errorHandlerNested = prevErrorHandlerNested;

		if(ctx.errorHandlerNested)
		{
			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}

		ctx.errorCount++;

		return FunctionValue();
	}

	ctx.functionInstanceDepth--;

	// Restore old scope
	ctx.SwitchToScopeAtPoint(scope, NULL);

	memcpy(&ctx.errorHandler, &prevErrorHandler, sizeof(jmp_buf));
	ctx.errorHandlerNested = prevErrorHandlerNested;

	ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(expr);

	assert(definition);

	if(definition->contextVariableDefinition)
	{
		if(ExprGenericFunctionPrototype *genericProto = getType<ExprGenericFunctionPrototype>(function->declaration))
			genericProto->contextVariables.push_back(definition->contextVariableDefinition);
		else
			ctx.setup.push_back(definition->contextVariableDefinition);
	}

	if(standalone)
		return FunctionValue();

	ExprBase *context = proto.context;

	if(!definition->function->scope->ownerType)
	{
		assert(isType<ExprNullptrLiteral>(context));

		context = CreateFunctionContextAccess(ctx, ctx.MakeInternal(source), definition->function);
	}

	return FunctionValue(source, definition->function, CreateSequence(ctx, source, definition, context));
}